

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

_Bool trans_SINCDECP_z(DisasContext_conflict1 *s,arg_incdec2_pred *a)

{
  int iVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  TCGTemp *pTVar3;
  long lVar4;
  
  iVar1 = a->esz;
  if (iVar1 != 0) {
    s_00 = s->uc->tcg_ctx;
    _Var2 = sve_access_check_aarch64(s);
    if (_Var2) {
      pTVar3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      lVar4 = (long)pTVar3 - (long)s_00;
      do_cntp((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(TCGv_i64)s->uc->tcg_ctx,(int)lVar4,
              a->esz,a->pg);
      do_sat_addsub_vec((DisasContext_conflict1 *)(ulong)(uint)s->sve_len,(int)s->uc->tcg_ctx,a->esz
                        ,a->rd,(TCGv_i64)(ulong)(uint)a->rn,SUB81(lVar4,0),a->u != 0);
    }
  }
  return iVar1 != 0;
}

Assistant:

static bool trans_SINCDECP_z(DisasContext *s, arg_incdec2_pred *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 val = tcg_temp_new_i64(tcg_ctx);
        do_cntp(s, val, a->esz, a->pg, a->pg);
        do_sat_addsub_vec(s, a->esz, a->rd, a->rn, val, a->u, a->d);
    }
    return true;
}